

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraph_p.h
# Opt level: O2

AnchorData * __thiscall
Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
          (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this,
          AnchorVertex *first,AnchorVertex *second)

{
  Span *pSVar1;
  Span *pSVar2;
  AnchorData *pAVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  const_iterator cVar5;
  const_iterator cVar6;
  AnchorVertex *local_18;
  AnchorVertex *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = second;
  local_10 = first;
  cVar5 = QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>>
          ::constFindImpl<QtGraphicsAnchorLayout::AnchorVertex*>
                    ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>>
                      *)this,&local_10);
  if (cVar5.i.d !=
      (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
       *)0x0 || cVar5.i.bucket != 0) {
    pSVar1 = (cVar5.i.d)->spans;
    uVar4 = cVar5.i.bucket >> 7;
    cVar6 = QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>::
            constFindImpl<QtGraphicsAnchorLayout::AnchorVertex*>
                      ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>
                        *)(pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)cVar5.i.bucket & 0x7f]]
                           .storage.data + 8),&local_18);
    if (cVar6.i.d !=
        (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
         *)0x0 || cVar6.i.bucket != 0) {
      pSVar2 = (cVar6.i.d)->spans;
      uVar4 = cVar6.i.bucket >> 7;
      pAVar3 = *(AnchorData **)
                (pSVar2[uVar4].entries[pSVar2[uVar4].offsets[(uint)cVar6.i.bucket & 0x7f]].storage.
                 data + 8);
      goto LAB_00560c83;
    }
  }
  pAVar3 = (AnchorData *)0x0;
LAB_00560c83:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pAVar3;
  }
  __stack_chk_fail();
}

Assistant:

EdgeData *edgeData(Vertex* first, Vertex* second) {
        const auto it = m_graph.constFind(first);
        if (it == m_graph.cend())
            return nullptr;
        const auto jt = it->constFind(second);
        if (jt == it->cend())
            return nullptr;
        return *jt;
    }